

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  BYTE *ip;
  ulong *puVar8;
  BYTE *ostart;
  ulong uVar9;
  ulong *puVar10;
  uint uVar11;
  uint uVar12;
  ulong *puVar13;
  
  if (dstSize < 8) {
    return 0;
  }
  uVar5 = 0;
  if (dstSize == 8) {
    return 0;
  }
  puVar8 = (ulong *)((long)dst + (dstSize - 8));
  uVar9 = srcSize & 0xfffffffffffffffc;
  uVar6 = (uint)srcSize & 3;
  uVar7 = (ulong)uVar6;
  switch(uVar6) {
  case 0:
    puVar10 = (ulong *)dst;
    goto joined_r0x00138bc3;
  case 1:
    uVar7 = 0;
    goto LAB_00138b85;
  case 2:
    uVar7 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar9 + 2);
    uVar7 = (ulong)CTable[bVar1].val;
    uVar5 = (ulong)CTable[bVar1].nbBits;
  }
  bVar1 = *(byte *)((long)src + uVar9 + 1);
  uVar7 = (ulong)CTable[bVar1].val << (uVar5 & 0x3f) | uVar7;
  uVar5 = (ulong)((uint)CTable[bVar1].nbBits + (int)uVar5);
LAB_00138b85:
  uVar7 = (ulong)CTable[*(byte *)((long)src + uVar9)].val << (uVar5 & 0x3f) | uVar7;
  uVar6 = (uint)CTable[*(byte *)((long)src + uVar9)].nbBits + (int)uVar5;
  *(ulong *)dst = uVar7;
  puVar10 = (ulong *)((ulong)(uVar6 >> 3) + (long)dst);
  if (puVar8 < puVar10) {
    puVar10 = puVar8;
  }
  uVar5 = (ulong)(uVar6 & 7);
  uVar7 = uVar7 >> ((ulong)((byte)uVar6 & 0xf8) & 0x3f);
joined_r0x00138bc3:
  for (; uVar9 != 0; uVar9 = uVar9 - 4) {
    bVar1 = *(byte *)((long)src + (uVar9 - 1));
    uVar11 = (uint)CTable[bVar1].nbBits + (int)uVar5;
    bVar2 = *(byte *)((long)src + (uVar9 - 2));
    uVar6 = CTable[bVar2].nbBits + uVar11;
    bVar3 = *(byte *)((long)src + (uVar9 - 3));
    uVar12 = CTable[bVar3].nbBits + uVar6;
    bVar4 = *(byte *)((long)src + (uVar9 - 4));
    uVar7 = (ulong)CTable[bVar4].val << ((ulong)uVar12 & 0x3f) |
            (ulong)CTable[bVar3].val << ((ulong)uVar6 & 0x3f) |
            (ulong)CTable[bVar2].val << ((ulong)uVar11 & 0x3f) |
            (ulong)CTable[bVar1].val << uVar5 | uVar7;
    uVar12 = CTable[bVar4].nbBits + uVar12;
    puVar13 = (ulong *)((ulong)(uVar12 >> 3) + (long)puVar10);
    if (puVar8 < puVar13) {
      puVar13 = puVar8;
    }
    uVar5 = (ulong)(uVar12 & 7);
    *puVar10 = uVar7;
    uVar7 = uVar7 >> ((ulong)((byte)uVar12 & 0xf8) & 0x3f);
    puVar10 = puVar13;
  }
  uVar6 = (int)uVar5 + 1;
  *puVar10 = uVar7 | 1L << uVar5;
  puVar10 = (ulong *)((ulong)(uVar6 >> 3) + (long)puVar10);
  if (puVar8 < puVar10) {
    puVar10 = puVar8;
  }
  if (puVar8 <= puVar10) {
    return 0;
  }
  return (long)puVar10 - ((long)dst + ((ulong)((uVar6 & 7) == 0) - 1));
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    size_t n;
    BIT_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = BIT_initCStream(&bitC, op, oend-op);
      if (HUF_isError(initErr)) return 0; }

    n = srcSize & ~3;  /* join to mod 4 */
    switch (srcSize & 3)
    {
        case 3 : HUF_encodeSymbol(&bitC, ip[n+ 2], CTable);
                 HUF_FLUSHBITS_2(&bitC);
		 /* fall-through */
        case 2 : HUF_encodeSymbol(&bitC, ip[n+ 1], CTable);
                 HUF_FLUSHBITS_1(&bitC);
		 /* fall-through */
        case 1 : HUF_encodeSymbol(&bitC, ip[n+ 0], CTable);
                 HUF_FLUSHBITS(&bitC);
		 /* fall-through */
        case 0 : /* fall-through */
        default: break;
    }

    for (; n>0; n-=4) {  /* note : n&3==0 at this stage */
        HUF_encodeSymbol(&bitC, ip[n- 1], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 2], CTable);
        HUF_FLUSHBITS_2(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 3], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 4], CTable);
        HUF_FLUSHBITS(&bitC);
    }

    return BIT_closeCStream(&bitC);
}